

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::MiscTest_CppTypeNames_Test::~MiscTest_CppTypeNames_Test
          (MiscTest_CppTypeNames_Test *this)

{
  MiscTest::~MiscTest(&this->super_MiscTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(MiscTest, CppTypeNames) {
  // Test that correct CPP type names are returned.

  typedef FieldDescriptor FD;  // avoid ugly line wrapping

  EXPECT_EQ(absl::string_view("double"),
            GetCppTypeNameForFieldType(FD::TYPE_DOUBLE));
  EXPECT_EQ(absl::string_view("float"),
            GetCppTypeNameForFieldType(FD::TYPE_FLOAT));
  EXPECT_EQ(absl::string_view("int64"),
            GetCppTypeNameForFieldType(FD::TYPE_INT64));
  EXPECT_EQ(absl::string_view("uint64"),
            GetCppTypeNameForFieldType(FD::TYPE_UINT64));
  EXPECT_EQ(absl::string_view("int32"),
            GetCppTypeNameForFieldType(FD::TYPE_INT32));
  EXPECT_EQ(absl::string_view("uint64"),
            GetCppTypeNameForFieldType(FD::TYPE_FIXED64));
  EXPECT_EQ(absl::string_view("uint32"),
            GetCppTypeNameForFieldType(FD::TYPE_FIXED32));
  EXPECT_EQ(absl::string_view("bool"),
            GetCppTypeNameForFieldType(FD::TYPE_BOOL));
  EXPECT_EQ(absl::string_view("string"),
            GetCppTypeNameForFieldType(FD::TYPE_STRING));
  EXPECT_EQ(absl::string_view("message"),
            GetCppTypeNameForFieldType(FD::TYPE_GROUP));
  EXPECT_EQ(absl::string_view("message"),
            GetCppTypeNameForFieldType(FD::TYPE_MESSAGE));
  EXPECT_EQ(absl::string_view("string"),
            GetCppTypeNameForFieldType(FD::TYPE_BYTES));
  EXPECT_EQ(absl::string_view("uint32"),
            GetCppTypeNameForFieldType(FD::TYPE_UINT32));
  EXPECT_EQ(absl::string_view("enum"),
            GetCppTypeNameForFieldType(FD::TYPE_ENUM));
  EXPECT_EQ(absl::string_view("int32"),
            GetCppTypeNameForFieldType(FD::TYPE_SFIXED32));
  EXPECT_EQ(absl::string_view("int64"),
            GetCppTypeNameForFieldType(FD::TYPE_SFIXED64));
  EXPECT_EQ(absl::string_view("int32"),
            GetCppTypeNameForFieldType(FD::TYPE_SINT32));
  EXPECT_EQ(absl::string_view("int64"),
            GetCppTypeNameForFieldType(FD::TYPE_SINT64));
}